

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O2

bool __thiscall
Remapper::remap_stream_output
          (Remapper *this,D3DStreamOutput *d3d_output,VulkanStreamOutput *vk_output)

{
  dxil_spv_bool dVar1;
  bool bVar2;
  dxil_spv_vulkan_stream_output c_vk_output;
  dxil_spv_d3d_stream_output c_output;
  dxil_spv_vulkan_stream_output local_38;
  dxil_spv_d3d_stream_output local_20;
  
  local_20.semantic = d3d_output->semantic;
  local_20.semantic_index = d3d_output->semantic_index;
  local_38.offset = 0;
  local_38.stride = 0;
  local_38.buffer_index = 0;
  local_38.enable = '\0';
  local_38._13_3_ = 0;
  bVar2 = true;
  if (this->output_remapper != (dxil_spv_stream_output_remapper_cb)0x0) {
    dVar1 = (*this->output_remapper)(this->output_userdata,&local_20,&local_38);
    if (dVar1 == '\x01') {
      vk_output->enable = local_38.enable != '\0';
      vk_output->offset = local_38.offset;
      vk_output->stride = local_38.stride;
      vk_output->buffer_index = local_38.buffer_index;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool remap_stream_output(const D3DStreamOutput &d3d_output, VulkanStreamOutput &vk_output) override
	{
		dxil_spv_d3d_stream_output c_output = { d3d_output.semantic, d3d_output.semantic_index };
		dxil_spv_vulkan_stream_output c_vk_output = {};

		if (output_remapper)
		{
			if (output_remapper(output_userdata, &c_output, &c_vk_output) == DXIL_SPV_TRUE)
			{
				vk_output.enable = bool(c_vk_output.enable);
				vk_output.offset = c_vk_output.offset;
				vk_output.stride = c_vk_output.stride;
				vk_output.buffer_index = c_vk_output.buffer_index;
				return true;
			}
			else
				return false;
		}
		else
		{
			return true;
		}
	}